

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O0

void __thiscall QDomNamedNodeMapPrivate::clearMap(QDomNamedNodeMapPrivate *this)

{
  bool bVar1;
  QDomNodePrivate **ppQVar2;
  const_iterator *in_RDI;
  long in_FS_OFFSET;
  const_iterator it;
  QDomNodePrivate *in_stack_ffffffffffffffb0;
  QMultiHash<QString,_QDomNodePrivate_*> *in_stack_ffffffffffffffd0;
  const_iterator local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_RDI[1].i.bucket & 0x100) == 0) {
    local_20.i.d = (Data<QHashPrivate::MultiNode<QString,_QDomNodePrivate_*>_> *)
                   &DAT_aaaaaaaaaaaaaaaa;
    local_20.i.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
    local_20.e = (Chain **)&DAT_aaaaaaaaaaaaaaaa;
    QMultiHash<QString,_QDomNodePrivate_*>::constBegin(in_stack_ffffffffffffffd0);
    while( true ) {
      QMultiHash<QString,_QDomNodePrivate_*>::constEnd
                ((QMultiHash<QString,_QDomNodePrivate_*> *)in_stack_ffffffffffffffb0);
      bVar1 = QMultiHash<QString,_QDomNodePrivate_*>::const_iterator::operator!=
                        (&local_20,(const_iterator *)&stack0xffffffffffffffc8);
      if (!bVar1) break;
      QMultiHash<QString,_QDomNodePrivate_*>::const_iterator::value(&local_20);
      bVar1 = QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x112244);
      if (!bVar1) {
        ppQVar2 = QMultiHash<QString,_QDomNodePrivate_*>::const_iterator::value(&local_20);
        in_stack_ffffffffffffffb0 = *ppQVar2;
        if (in_stack_ffffffffffffffb0 != (QDomNodePrivate *)0x0) {
          (*in_stack_ffffffffffffffb0->_vptr_QDomNodePrivate[1])();
        }
      }
      QMultiHash<QString,_QDomNodePrivate_*>::const_iterator::operator++(in_RDI);
    }
  }
  QMultiHash<QString,_QDomNodePrivate_*>::clear
            ((QMultiHash<QString,_QDomNodePrivate_*> *)in_stack_ffffffffffffffb0);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDomNamedNodeMapPrivate::clearMap()
{
    // Dereference all of our children if we took references
    if (!appendToParent) {
        auto it = map.constBegin();
        for (; it != map.constEnd(); ++it)
            if (!it.value()->ref.deref())
                delete it.value();
    }
    map.clear();
}